

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O2

void coda_base58_encode(char *in,size_t inlen,char *out,size_t outlen)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  void *__ptr;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  sVar7 = inlen;
  if (outlen < inlen) {
    sVar7 = outlen;
  }
  pbVar6 = (byte *)(in + sVar7);
  uVar8 = inlen * 0x8a;
  sVar7 = 0;
  while( true ) {
    if ((outlen == sVar7) || (inlen == sVar7)) goto LAB_001015ff;
    if (in[sVar7] != '\0') break;
    out[sVar7] = '1';
    uVar8 = uVar8 - 0x8a;
    sVar7 = sVar7 + 1;
  }
  pbVar6 = (byte *)(in + sVar7);
LAB_001015ff:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  iVar2 = SUB164(auVar1 / ZEXT816(100),0);
  __ptr = calloc((ulong)(iVar2 + 1),1);
  lVar9 = inlen - sVar7;
  while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
    uVar3 = (uint)*pbVar6;
    for (lVar5 = (long)iVar2; (uVar3 != 0 || (-1 < lVar5)); lVar5 = lVar5 + -1) {
      uVar4 = *(char *)((long)__ptr + lVar5) * 0x100 + uVar3;
      uVar3 = uVar4 / 0x3a;
      *(char *)((long)__ptr + lVar5) = (char)((ulong)uVar4 % 0x3a);
    }
    pbVar6 = pbVar6 + 1;
  }
  for (lVar9 = 0; ((int)(uVar8 / 100) + 1 != (int)lVar9 && (*(char *)((long)__ptr + lVar9) == '\0'))
      ; lVar9 = lVar9 + 1) {
  }
  for (lVar5 = 0; (outlen - sVar7 != lVar5 && (((int)(uVar8 / 100) + 1) - (int)lVar9 != (int)lVar5))
      ; lVar5 = lVar5 + 1) {
    out[sVar7 + lVar5] =
         "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"
         [*(byte *)((long)__ptr + lVar9 + lVar5)];
  }
  if (outlen - sVar7 != lVar5) {
    out[sVar7 + lVar5] = '\0';
  }
  free(__ptr);
  return;
}

Assistant:

void coda_base58_encode (const char* in, size_t inlen, char* out, size_t outlen)
{
    static const char b58str[58] = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz";

    while (outlen && inlen && !*in)
    {
        *out++ = '1';
        outlen--;

        in++;
        inlen--;
    }

    unsigned b58len = inlen * 138 / 100 + 1; // log(256) / log(58), rounded up.
    char* b58_begin = NULL;
    char* b58_curr = NULL;
    b58_begin = b58_curr = (char*)calloc(b58len, sizeof(unsigned char));

    while (inlen)
    {
        unsigned int carry = (unsigned char)*in++;
        int i;
        for (i = b58len - 1; carry || i >= 0; i--)
        {
            carry += 256 * b58_curr[i];
            b58_curr[i] = carry % 58;
            carry /= 58;
        }
        inlen--;
    }

    // Skip leading zeroes in base58 result.
    while (b58len && !*b58_curr)
    {
        b58_curr++;
        b58len--;
    }

    while (outlen && b58len)
    {
        *out++ = b58str[(unsigned char)*b58_curr++];
        b58len--;
        outlen--;
    }

    if (outlen) *out = '\0';

    free(b58_begin);
}